

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::NotifyDataSourceStartedRequest::operator==
          (NotifyDataSourceStartedRequest *this,NotifyDataSourceStartedRequest *other)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (this->unknown_fields_)._M_string_length;
  if (__n == (other->unknown_fields_)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                   (other->unknown_fields_)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(this->data_source_id_ == other->data_source_id_ & bVar2);
}

Assistant:

bool NotifyDataSourceStartedRequest::operator==(const NotifyDataSourceStartedRequest& other) const {
  return unknown_fields_ == other.unknown_fields_
   && data_source_id_ == other.data_source_id_;
}